

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O0

void __thiscall ON_Buffer::ON_Buffer(ON_Buffer *this,ON_Buffer *src)

{
  ON_Buffer *src_local;
  ON_Buffer *this_local;
  
  this->m_buffer_size = 0;
  this->m_current_position = 0;
  this->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_error_handler = (ON_Buffer_ErrorHandler)0x0;
  this->m_last_error = 0;
  memset(this->m_reserved,0,0xc);
  Copy(this,src);
  return;
}

Assistant:

ON_Buffer::ON_Buffer( const ON_Buffer& src )
: m_buffer_size(0)
, m_current_position(0)
, m_first_segment(0)
, m_last_segment(0)
, m_current_segment(0)
, m_error_handler(0)
, m_last_error(0)
{
  memset(m_reserved,0,sizeof(m_reserved));
  Copy(src);
}